

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O3

void __thiscall AGSMock::MockEngine::free(MockEngine *this,void *__ptr)

{
  int iVar1;
  iterator __it;
  char in_DL;
  void *local_20;
  
  local_20 = __ptr;
  __it = std::
         _Hashtable<void_*,_std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>,_std::allocator<std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
         ::find(&(this->data_->objects)._M_h,&local_20);
  if ((__it.
       super__Node_iterator_base<std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>,_false>
       ._M_cur != (__node_type *)0x0) &&
     ((in_DL != '\0' ||
      (iVar1 = *(int *)((long)__it.
                              super__Node_iterator_base<std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>,_false>
                              ._M_cur + 0x10),
      *(int *)((long)__it.
                     super__Node_iterator_base<std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>,_false>
                     ._M_cur + 0x10) = iVar1 + -1, iVar1 < 2)))) {
    iVar1 = (**(code **)**(undefined8 **)
                          ((long)__it.
                                 super__Node_iterator_base<std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>,_false>
                                 ._M_cur + 0x18))
                      (*(undefined8 **)
                        ((long)__it.
                               super__Node_iterator_base<std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>,_false>
                               ._M_cur + 0x18),local_20,in_DL);
    if (iVar1 != 0) {
      std::
      _Hashtable<void_*,_std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>,_std::allocator<std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::erase(&(this->data_->objects)._M_h,
              (const_iterator)
              __it.
              super__Node_iterator_base<std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>,_false>
              ._M_cur);
    }
  }
  return;
}

Assistant:

void MockEngine::free(void *object, bool force)
{
	decltype(data_->objects)::iterator it = data_->objects.find(object);

	if (it == data_->objects.end())
		return;

	if (!force && --it->second.count > 0)
		return;

	if (!it->second.callback->Dispose((const char *) object, force ? 1 : 0))
		return;

	data_->objects.erase(it);
}